

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

Matrix<float,_2,_1> __thiscall
tcu::operator*(tcu *this,Matrix<float,_2,_2> *a,Matrix<float,_2,_1> *b)

{
  Matrix<float,_2,_1> MVar1;
  int row;
  long lVar2;
  int ndx;
  long lVar3;
  float v;
  float extraout_XMM0_Da;
  float fVar4;
  float extraout_XMM0_Db;
  float fVar5;
  
  Matrix<float,_2,_1>::Matrix((Matrix<float,_2,_1> *)this);
  fVar4 = extraout_XMM0_Da;
  fVar5 = extraout_XMM0_Db;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    fVar4 = 0.0;
    fVar5 = 0.0;
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      fVar4 = fVar4 + *(float *)((long)a + lVar3 * 2 * 4) * (b->m_data).m_data[0].m_data[lVar3];
    }
    *(float *)(this + lVar2 * 4) = fVar4;
    a = (Matrix<float,_2,_2> *)((long)a + 4);
  }
  MVar1.m_data.m_data[0].m_data[1] = fVar5;
  MVar1.m_data.m_data[0].m_data[0] = fVar4;
  return (Matrix<float,_2,_1>)MVar1.m_data.m_data[0].m_data;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}